

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mime.c
# Opt level: O3

CURLcode Curl_mime_prepare_headers
                   (curl_mimepart *part,char *contenttype,char *disposition,mimestrategy strategy)

{
  curl_slist **slp;
  bool bVar1;
  char *pcVar2;
  char *pcVar3;
  CURLcode CVar4;
  int iVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  curl_mimepart *part_00;
  char *local_50;
  
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = (curl_slist *)0x0;
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = (void *)0x0;
    (part->state).offset = 0;
  }
  pcVar6 = part->mimetype;
  if (pcVar6 == (char *)0x0) {
    pcVar6 = search_header(part->userheaders,"Content-Type");
  }
  if (pcVar6 != (char *)0x0) {
    contenttype = pcVar6;
  }
  if (contenttype == (char *)0x0) {
    if (part->kind == MIMEKIND_MULTIPART) {
      contenttype = "multipart/mixed";
    }
    else if (part->kind == MIMEKIND_FILE) {
      contenttype = Curl_mime_contenttype(part->filename);
      if (((contenttype == (char *)0x0) &&
          (contenttype = Curl_mime_contenttype(part->data), contenttype == (char *)0x0)) &&
         (contenttype = "application/octet-stream", part->filename == (char *)0x0)) {
        contenttype = (char *)0x0;
      }
    }
    else {
      contenttype = Curl_mime_contenttype(part->filename);
    }
  }
  if (part->kind == MIMEKIND_MULTIPART) {
    part_00 = (curl_mimepart *)part->arg;
    if (part_00 == (curl_mimepart *)0x0) goto LAB_0043b0e1;
    local_50 = part_00->data;
  }
  else {
    if (((pcVar6 == (char *)0x0) && (contenttype != (char *)0x0)) &&
       ((iVar5 = Curl_strcasecompare(contenttype,"text/plain"), iVar5 != 0 &&
        ((strategy == MIMESTRATEGY_MAIL || (part->filename == (char *)0x0)))))) {
      contenttype = (char *)0x0;
    }
LAB_0043b0e1:
    part_00 = (curl_mimepart *)0x0;
    local_50 = (char *)0x0;
  }
  slp = &part->curlheaders;
  pcVar6 = search_header(part->userheaders,"Content-Disposition");
  if (pcVar6 == (char *)0x0) {
    if (((disposition != (char *)0x0) || (disposition = "attachment", part->filename != (char *)0x0)
        ) || (part->name != (char *)0x0)) {
LAB_0043b175:
      iVar5 = curl_strequal(disposition,"attachment");
      pcVar6 = part->name;
      if (iVar5 == 0) {
        if (pcVar6 == (char *)0x0) goto LAB_0043b1c2;
LAB_0043b1a6:
        pcVar6 = escape_string(pcVar6);
        if (pcVar6 != (char *)0x0) goto LAB_0043b1c4;
        CVar4 = CURLE_OUT_OF_MEMORY;
        pcVar7 = (char *)0x0;
        pcVar6 = (char *)0x0;
      }
      else {
        if (pcVar6 != (char *)0x0) goto LAB_0043b1a6;
        if (part->filename == (char *)0x0) goto LAB_0043b108;
LAB_0043b1c2:
        pcVar6 = (char *)0x0;
LAB_0043b1c4:
        if (part->filename == (char *)0x0) {
          pcVar7 = (char *)0x0;
        }
        else {
          pcVar7 = escape_string(part->filename);
          if (pcVar7 == (char *)0x0) {
            CVar4 = CURLE_OUT_OF_MEMORY;
            pcVar7 = (char *)0x0;
            goto LAB_0043b25f;
          }
        }
        pcVar8 = "; name=\"";
        pcVar10 = pcVar6;
        if (pcVar6 == (char *)0x0) {
          pcVar8 = "";
          pcVar10 = "";
        }
        pcVar2 = "\n\t\t\t\"";
        pcVar3 = "\n\t\t\t\"";
        if (pcVar6 == (char *)0x0) {
          pcVar3 = "PK\x01\x02";
        }
        pcVar11 = "; filename=\"";
        pcVar9 = pcVar7;
        if (pcVar7 == (char *)0x0) {
          pcVar11 = "";
          pcVar9 = "";
          pcVar2 = "PK\x01\x02";
        }
        CVar4 = Curl_mime_add_header
                          (slp,"Content-Disposition: %s%s%s%s%s%s%s",disposition,pcVar8,pcVar10,
                           pcVar3 + 4,pcVar11,pcVar9,pcVar2 + 4);
      }
LAB_0043b25f:
      (*Curl_cfree)(pcVar6);
      (*Curl_cfree)(pcVar7);
      if (CVar4 != CURLE_OK) {
        return CVar4;
      }
      goto LAB_0043b108;
    }
    if (contenttype != (char *)0x0) {
      iVar5 = Curl_strncasecompare(contenttype,"multipart/",10);
      if (iVar5 == 0) goto LAB_0043b175;
      goto LAB_0043b111;
    }
LAB_0043b2a6:
    bVar1 = false;
  }
  else {
LAB_0043b108:
    if (contenttype == (char *)0x0) goto LAB_0043b2a6;
LAB_0043b111:
    pcVar6 = "; boundary=";
    if (local_50 == (char *)0x0) {
      pcVar6 = "";
      local_50 = "";
    }
    CVar4 = Curl_mime_add_header(slp,"Content-Type: %s%s%s",contenttype,pcVar6,local_50);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
    bVar1 = true;
  }
  pcVar6 = search_header(part->userheaders,"Content-Transfer-Encoding");
  if (pcVar6 == (char *)0x0) {
    if (part->encoder == (mime_encoder *)0x0) {
      if ((!bVar1 || strategy != MIMESTRATEGY_MAIL) || (part->kind == MIMEKIND_MULTIPART))
      goto LAB_0043b2c2;
      pcVar6 = "8bit";
    }
    else {
      pcVar6 = part->encoder->name;
      if (pcVar6 == (char *)0x0) goto LAB_0043b2c2;
    }
    CVar4 = Curl_mime_add_header(slp,"Content-Transfer-Encoding: %s",pcVar6);
    if (CVar4 != CURLE_OK) {
      return CVar4;
    }
  }
LAB_0043b2c2:
  if ((part->state).state == MIMESTATE_CURLHEADERS) {
    (part->state).ptr = part->curlheaders;
    (part->state).offset = 0;
  }
  CVar4 = CURLE_OK;
  if ((part_00 != (curl_mimepart *)0x0) && (part->kind == MIMEKIND_MULTIPART)) {
    iVar5 = Curl_strcasecompare(contenttype,"multipart/form-data");
    pcVar6 = (char *)0x0;
    if (iVar5 != 0) {
      pcVar6 = "form-data";
    }
    do {
      part_00 = part_00->nextpart;
      if (part_00 == (curl_mimepart *)0x0) {
        return CURLE_OK;
      }
      CVar4 = Curl_mime_prepare_headers(part_00,(char *)0x0,pcVar6,strategy);
    } while (CVar4 == CURLE_OK);
  }
  return CVar4;
}

Assistant:

CURLcode Curl_mime_prepare_headers(curl_mimepart *part,
                                   const char *contenttype,
                                   const char *disposition,
                                   enum mimestrategy strategy)
{
  curl_mime *mime = NULL;
  const char *boundary = NULL;
  char *customct;
  const char *cte = NULL;
  CURLcode ret = CURLE_OK;

  /* Get rid of previously prepared headers. */
  curl_slist_free_all(part->curlheaders);
  part->curlheaders = NULL;

  /* Be sure we won't access old headers later. */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, NULL);

  /* Check if content type is specified. */
  customct = part->mimetype;
  if(!customct)
    customct = search_header(part->userheaders, "Content-Type");
  if(customct)
    contenttype = customct;

  /* If content type is not specified, try to determine it. */
  if(!contenttype) {
    switch(part->kind) {
    case MIMEKIND_MULTIPART:
      contenttype = MULTIPART_CONTENTTYPE_DEFAULT;
      break;
    case MIMEKIND_FILE:
      contenttype = Curl_mime_contenttype(part->filename);
      if(!contenttype)
        contenttype = Curl_mime_contenttype(part->data);
      if(!contenttype && part->filename)
        contenttype = FILE_CONTENTTYPE_DEFAULT;
      break;
    default:
      contenttype = Curl_mime_contenttype(part->filename);
      break;
    }
  }

  if(part->kind == MIMEKIND_MULTIPART) {
    mime = (curl_mime *) part->arg;
    if(mime)
      boundary = mime->boundary;
  }
  else if(contenttype && !customct &&
          strcasecompare(contenttype, "text/plain"))
    if(strategy == MIMESTRATEGY_MAIL || !part->filename)
      contenttype = NULL;

  /* Issue content-disposition header only if not already set by caller. */
  if(!search_header(part->userheaders, "Content-Disposition")) {
    if(!disposition)
      if(part->filename || part->name ||
        (contenttype && !strncasecompare(contenttype, "multipart/", 10)))
          disposition = DISPOSITION_DEFAULT;
    if(disposition && curl_strequal(disposition, "attachment") &&
     !part->name && !part->filename)
      disposition = NULL;
    if(disposition) {
      char *name = NULL;
      char *filename = NULL;

      if(part->name) {
        name = escape_string(part->name);
        if(!name)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret && part->filename) {
        filename = escape_string(part->filename);
        if(!filename)
          ret = CURLE_OUT_OF_MEMORY;
      }
      if(!ret)
        ret = Curl_mime_add_header(&part->curlheaders,
                                   "Content-Disposition: %s%s%s%s%s%s%s",
                                   disposition,
                                   name? "; name=\"": "",
                                   name? name: "",
                                   name? "\"": "",
                                   filename? "; filename=\"": "",
                                   filename? filename: "",
                                   filename? "\"": "");
      Curl_safefree(name);
      Curl_safefree(filename);
      if(ret)
        return ret;
      }
    }

  /* Issue Content-Type header. */
  if(contenttype) {
    ret = add_content_type(&part->curlheaders, contenttype, boundary);
    if(ret)
      return ret;
  }

  /* Content-Transfer-Encoding header. */
  if(!search_header(part->userheaders, "Content-Transfer-Encoding")) {
    if(part->encoder)
      cte = part->encoder->name;
    else if(contenttype && strategy == MIMESTRATEGY_MAIL &&
     part->kind != MIMEKIND_MULTIPART)
      cte = "8bit";
    if(cte) {
      ret = Curl_mime_add_header(&part->curlheaders,
                                 "Content-Transfer-Encoding: %s", cte);
      if(ret)
        return ret;
    }
  }

  /* If we were reading curl-generated headers, restart with new ones (this
     should not occur). */
  if(part->state.state == MIMESTATE_CURLHEADERS)
    mimesetstate(&part->state, MIMESTATE_CURLHEADERS, part->curlheaders);

  /* Process subparts. */
  if(part->kind == MIMEKIND_MULTIPART && mime) {
    curl_mimepart *subpart;

    disposition = NULL;
    if(strcasecompare(contenttype, "multipart/form-data"))
      disposition = "form-data";
    for(subpart = mime->firstpart; subpart; subpart = subpart->nextpart) {
      ret = Curl_mime_prepare_headers(subpart, NULL, disposition, strategy);
      if(ret)
        return ret;
    }
  }
  return ret;
}